

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncomingMessage.cpp
# Opt level: O2

bool __thiscall
DIS::IncomingMessage::RemoveProcessor(IncomingMessage *this,uchar id,IPacketProcessor *pp)

{
  bool bVar1;
  iterator containerIter;
  iterator local_18;
  
  local_18._M_node = (_Base_ptr)0x0;
  bVar1 = FindProccessorContainer(this,id,pp,&local_18);
  if (bVar1) {
    std::
    _Rb_tree<unsigned_char,std::pair<unsigned_char_const,DIS::IPacketProcessor*>,std::_Select1st<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_char,std::pair<unsigned_char_const,DIS::IPacketProcessor*>,std::_Select1st<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,DIS::IPacketProcessor*>>>
                        *)&this->_processors,(iterator)local_18._M_node);
  }
  return bVar1;
}

Assistant:

bool IncomingMessage::RemoveProcessor(unsigned char id, const IPacketProcessor* pp)
{
   PacketProcessorContainer::iterator containerIter;

   if (FindProccessorContainer(id, pp, containerIter))
   {
      // Erases only the single pair found in the interator
      _processors.erase( containerIter );
      return true;
   }

   // The pair doesn't exist
   return false;
}